

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O0

void __thiscall
MT32Emu::LA32FloatPartialPair::deactivate(LA32FloatPartialPair *this,PairType useMaster)

{
  PairType useMaster_local;
  LA32FloatPartialPair *this_local;
  
  if (useMaster == MASTER) {
    LA32FloatWaveGenerator::deactivate(&this->master);
    this->masterOutputSample = 0.0;
  }
  else {
    LA32FloatWaveGenerator::deactivate(&this->slave);
    this->slaveOutputSample = 0.0;
  }
  return;
}

Assistant:

void LA32FloatPartialPair::deactivate(const PairType useMaster) {
	if (useMaster == MASTER) {
		master.deactivate();
		masterOutputSample = 0.0f;
	} else {
		slave.deactivate();
		slaveOutputSample = 0.0f;
	}
}